

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

LoopEvent rec_iterl(jit_State *J,BCIns iterins)

{
  uint slot;
  uint local_24;
  BCReg ra;
  BCIns iterins_local;
  jit_State *J_local;
  
  slot = iterins >> 8 & 0xff;
  if (J->base[slot] == 0) {
    local_24 = sload(J,slot);
  }
  else {
    local_24 = J->base[slot];
  }
  if ((local_24 & 0x1f000000) == 0) {
    J->maxslot = slot - 3;
    J->pc = J->pc + 1;
    J_local._4_4_ = LOOPEV_LEAVE;
  }
  else {
    J->base[slot - 1] = J->base[slot];
    J->maxslot = (slot - 1) + (J->pc[-1] >> 0x18);
    J->pc = J->pc + ((ulong)(iterins >> 0x10) - 0x7fff);
    J_local._4_4_ = LOOPEV_ENTER;
  }
  return J_local._4_4_;
}

Assistant:

static LoopEvent rec_iterl(jit_State *J, const BCIns iterins)
{
  BCReg ra = bc_a(iterins);
  if (!tref_isnil(getslot(J, ra))) {  /* Looping back? */
    J->base[ra-1] = J->base[ra];  /* Copy result of ITERC to control var. */
    J->maxslot = ra-1+bc_b(J->pc[-1]);
    J->pc += bc_j(iterins)+1;
    return LOOPEV_ENTER;
  } else {
    J->maxslot = ra-3;
    J->pc++;
    return LOOPEV_LEAVE;
  }
}